

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  undefined4 uVar7;
  int iVar8;
  long lVar9;
  ushort uVar10;
  int iVar11;
  long lVar12;
  uint64_t uVar13;
  ushort uVar14;
  Fault f;
  uint local_1f8;
  Reader replacementSlot;
  Fault f_1;
  anon_class_8_1_a7e8901a _kjContextFunc798;
  Reader local_178;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:798:5)>
  _kjContext798;
  Maybe<capnp::schema::Field::Reader> local_f8;
  Maybe<capnp::schema::Node::Reader> local_c0;
  Maybe<capnp::schema::Field::Reader> local_88;
  Maybe<capnp::schema::Node::Reader> local_50;
  
  _kjContextFunc798.field = field;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:798:5)>
  ::ContextImpl(&_kjContext798,&_kjContextFunc798);
  uVar3 = (field->_reader).dataSize;
  uVar14 = 0;
  uVar10 = 0;
  if ((0x1f < uVar3) && (uVar1 = *(ushort *)((long)(field->_reader).data + 2), uVar1 != 0)) {
    uVar10 = ~uVar1;
  }
  uVar4 = (replacement->_reader).dataSize;
  if ((0x1f < uVar4) && (uVar1 = *(ushort *)((long)(replacement->_reader).data + 2), uVar1 != 0)) {
    uVar14 = ~uVar1;
  }
  if (uVar10 != uVar14) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x325,FAILED,"discriminant == replacementDiscriminant",
               "\"Field discriminant changed.\"",(char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
    goto LAB_0042dbb2;
  }
  if (0x4f < uVar3) {
    pvVar5 = (field->_reader).data;
    sVar2 = *(short *)((long)pvVar5 + 8);
    if (sVar2 == 1) {
      if (0x4f < uVar4) {
        pvVar6 = (replacement->_reader).data;
        sVar2 = *(short *)((long)pvVar6 + 8);
        if (sVar2 == 1) {
          if (uVar3 < 0xc0) {
            lVar9 = 0;
          }
          else {
            lVar9 = *(long *)((long)pvVar5 + 0x10);
          }
          if (uVar4 < 0xc0) {
            lVar12 = 0;
          }
          else {
            lVar12 = *(long *)((long)pvVar6 + 0x10);
          }
          if (lVar9 != lVar12) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x349,FAILED,
                       "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                       "\"group id changed\"",(char (*) [17])"group id changed");
            this->compatibility = INCOMPATIBLE;
            kj::_::Debug::Fault::~Fault(&f);
          }
          goto LAB_0042dbb2;
        }
        if (sVar2 != 0) goto LAB_0042dbb2;
      }
      replacementSlot._reader.segment = (replacement->_reader).segment;
      replacementSlot._reader.capTable = (replacement->_reader).capTable;
      replacementSlot._reader.data = (replacement->_reader).data;
      replacementSlot._reader.pointers = (replacement->_reader).pointers;
      replacementSlot._reader.dataSize = (replacement->_reader).dataSize;
      replacementSlot._reader.pointerCount = (replacement->_reader).pointerCount;
      replacementSlot._reader._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
      replacementSlot._reader.nestingLimit = (replacement->_reader).nestingLimit;
      replacementSlot._reader._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
      capnp::schema::Field::Slot::Reader::getType((Reader *)&f,&replacementSlot);
      if ((field->_reader).dataSize < 0xc0) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(uint64_t *)((long)(field->_reader).data + 0x10);
      }
      local_c0.ptr.isSet = true;
      local_c0.ptr.field_1.value._reader.segment = (this->replacementNode)._reader.segment;
      local_c0.ptr.field_1.value._reader.capTable = (this->replacementNode)._reader.capTable;
      local_c0.ptr.field_1.value._reader.data = (this->replacementNode)._reader.data;
      local_c0.ptr.field_1.value._reader.pointers = (this->replacementNode)._reader.pointers;
      local_c0.ptr.field_1._32_4_ = (this->replacementNode)._reader.dataSize;
      local_c0.ptr.field_1._36_2_ = (this->replacementNode)._reader.pointerCount;
      local_c0.ptr.field_1._38_2_ = *(undefined2 *)&(this->replacementNode)._reader.field_0x26;
      local_c0.ptr.field_1._40_8_ = *(undefined8 *)&(this->replacementNode)._reader.nestingLimit;
      local_f8.ptr.isSet = true;
      local_f8.ptr.field_1.value._reader.segment = (replacement->_reader).segment;
      local_f8.ptr.field_1.value._reader.capTable = (replacement->_reader).capTable;
      local_f8.ptr.field_1.value._reader.data = (replacement->_reader).data;
      local_f8.ptr.field_1.value._reader.pointers = (replacement->_reader).pointers;
      local_f8.ptr.field_1._32_4_ = (replacement->_reader).dataSize;
      local_f8.ptr.field_1._36_2_ = (replacement->_reader).pointerCount;
      local_f8.ptr.field_1._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
      local_f8.ptr.field_1._40_8_ = *(undefined8 *)&(replacement->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&f,uVar13,&local_c0,&local_f8);
      goto LAB_0042dbb2;
    }
    if (sVar2 != 0) goto LAB_0042dbb2;
  }
  f.exception = (Exception *)(field->_reader).segment;
  pvVar5 = (field->_reader).data;
  uVar7 = (field->_reader).dataSize;
  if (0x4f < uVar4) {
    sVar2 = *(short *)((long)(replacement->_reader).data + 8);
    if (sVar2 == 1) {
      capnp::schema::Field::Slot::Reader::getType((Reader *)&replacementSlot,(Reader *)&f);
      if ((replacement->_reader).dataSize < 0xc0) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
      }
      local_50.ptr.isSet = true;
      local_50.ptr.field_1.value._reader.segment = (this->existingNode)._reader.segment;
      local_50.ptr.field_1.value._reader.capTable = (this->existingNode)._reader.capTable;
      local_50.ptr.field_1.value._reader.data = (this->existingNode)._reader.data;
      local_50.ptr.field_1.value._reader.pointers = (this->existingNode)._reader.pointers;
      local_50.ptr.field_1._32_4_ = (this->existingNode)._reader.dataSize;
      local_50.ptr.field_1._36_2_ = (this->existingNode)._reader.pointerCount;
      local_50.ptr.field_1._38_2_ = *(undefined2 *)&(this->existingNode)._reader.field_0x26;
      local_50.ptr.field_1._40_8_ = *(undefined8 *)&(this->existingNode)._reader.nestingLimit;
      local_88.ptr.isSet = true;
      local_88.ptr.field_1.value._reader.segment = (field->_reader).segment;
      local_88.ptr.field_1.value._reader.capTable = (field->_reader).capTable;
      local_88.ptr.field_1.value._reader.data = (field->_reader).data;
      local_88.ptr.field_1.value._reader.pointers = (field->_reader).pointers;
      local_88.ptr.field_1._32_4_ = (field->_reader).dataSize;
      local_88.ptr.field_1._36_2_ = (field->_reader).pointerCount;
      local_88.ptr.field_1._38_2_ = *(undefined2 *)&(field->_reader).field_0x26;
      local_88.ptr.field_1._40_8_ = *(undefined8 *)&(field->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&replacementSlot,uVar13,&local_50,&local_88);
      goto LAB_0042dbb2;
    }
    if (sVar2 != 0) goto LAB_0042dbb2;
  }
  replacementSlot._reader.segment = (replacement->_reader).segment;
  replacementSlot._reader.capTable = (replacement->_reader).capTable;
  replacementSlot._reader.data = (replacement->_reader).data;
  replacementSlot._reader.pointers = (replacement->_reader).pointers;
  replacementSlot._reader.dataSize = (replacement->_reader).dataSize;
  replacementSlot._reader.pointerCount = (replacement->_reader).pointerCount;
  replacementSlot._reader._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
  replacementSlot._reader.nestingLimit = (replacement->_reader).nestingLimit;
  replacementSlot._reader._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
  capnp::schema::Field::Slot::Reader::getType((Reader *)&f_1,(Reader *)&f);
  capnp::schema::Field::Slot::Reader::getType(&local_178,&replacementSlot);
  checkCompatibility(this,(Reader *)&f_1,&local_178,NO_UPGRADE_TO_STRUCT);
  capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)&f_1,(Reader *)&f);
  capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)&local_178,&replacementSlot);
  checkDefaultCompatibility(this,(Reader *)&f_1,(Reader *)&local_178);
  iVar8 = 0;
  iVar11 = 0;
  if (0x3f < (uint)uVar7) {
    iVar11 = *(int *)((long)pvVar5 + 4);
  }
  if (0x3f < replacementSlot._reader.dataSize) {
    iVar8 = *(int *)((long)replacementSlot._reader.data + 4);
  }
  if (iVar11 != iVar8) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x335,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
               "\"field position changed\"",(char (*) [23])"field position changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f_1);
  }
LAB_0042dbb2:
  kj::_::Debug::Context::~Context(&_kjContext798.super_Context);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }